

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::testGroupStarting
          (RunContext *this,string *testSpec,size_t groupIndex,size_t groupsCount)

{
  pointer _groupIndex;
  size_t in_stack_ffffffffffffff88;
  string *_name;
  GroupInfo *in_stack_ffffffffffffffa0;
  string local_50 [2];
  
  _groupIndex = clara::std::
                unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                ::operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                              *)0x128929);
  _name = local_50;
  GroupInfo::GroupInfo
            (in_stack_ffffffffffffffa0,_name,(size_t)_groupIndex,in_stack_ffffffffffffff88);
  (*_groupIndex->_vptr_IStreamingReporter[6])(_groupIndex,_name);
  GroupInfo::~GroupInfo((GroupInfo *)0x12896b);
  return;
}

Assistant:

void RunContext::testGroupStarting(std::string const& testSpec, std::size_t groupIndex, std::size_t groupsCount) {
        m_reporter->testGroupStarting(GroupInfo(testSpec, groupIndex, groupsCount));
    }